

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# way.cc
# Opt level: O0

void re2c::fprint_way(FILE *f,way_t *w)

{
  FILE *f_00;
  size_type sVar1;
  const_reference ppvVar2;
  ulong local_28;
  size_t i;
  size_t len;
  way_t *w_local;
  FILE *f_local;
  
  fprintf((FILE *)f,"\'");
  sVar1 = std::
          vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
          ::size(w);
  for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
    if (local_28 != 0) {
      fprintf((FILE *)f," ");
    }
    ppvVar2 = std::
              vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
              ::operator[](w,local_28);
    f_00 = _stderr;
    if (*ppvVar2 == (value_type)0x0) {
      fprintf(_stderr,"(nil)");
    }
    else {
      ppvVar2 = std::
                vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                ::operator[](w,local_28);
      fprint_way_arc((FILE *)f_00,*ppvVar2);
    }
  }
  fprintf((FILE *)f,"\'");
  return;
}

Assistant:

void fprint_way (FILE * f, const way_t & w)
{
	fprintf (f, "'");
	const size_t len = w.size ();
	for (size_t i = 0 ; i < len; ++i)
	{
		if (i > 0)
		{
			fprintf (f, " ");
		}
		if (w[i] == NULL)
		{
			fprintf (stderr, "(nil)");
		}
		else
		{
			fprint_way_arc (stderr, *w[i]);
		}
	}
	fprintf (f, "'");
}